

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.cpp
# Opt level: O1

int __thiscall IOContextDemuxer::get_byte(IOContextDemuxer *this)

{
  byte *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  int readRez;
  uint32_t readedBytes;
  int local_20;
  uint local_1c;
  
  local_1c = 0;
  local_20 = 0;
  if (this->m_curPos == this->m_bufEnd) {
    iVar2 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                      (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&local_1c,&local_20,0);
    if ((local_1c != 0) && (local_20 == 0)) {
      (*this->m_bufferedReader->_vptr_AbstractReader[5])
                (this->m_bufferedReader,(ulong)(uint)this->m_readerID);
    }
    this->m_lastReadRez = local_20;
    this->m_curPos = (uint8_t *)(CONCAT44(extraout_var,iVar2) + 0xbc);
    this->m_bufEnd = (uint8_t *)((ulong)local_1c + 0xbc + CONCAT44(extraout_var,iVar2));
    if ((ulong)local_1c == 0) {
      this->m_isEOF = true;
      return 0;
    }
  }
  this->m_processedBytes = this->m_processedBytes + 1;
  pbVar1 = this->m_curPos;
  this->m_curPos = pbVar1 + 1;
  return (uint)*pbVar1;
}

Assistant:

int IOContextDemuxer::get_byte()
{
    uint32_t readedBytes = 0;
    int readRez = 0;
    if (m_curPos == m_bufEnd)
    {
        uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);  // blocked read mode
        if (readedBytes > 0 && readRez == 0)
            m_bufferedReader->notify(m_readerID, readedBytes);
        m_lastReadRez = readRez;
        m_curPos = data + 188;
        m_bufEnd = m_curPos + readedBytes;
        if (m_curPos == m_bufEnd)
        {
            m_isEOF = true;
            return 0;
        }
    }
    m_processedBytes++;
    return *m_curPos++;
}